

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

unique_ptr<char_*[],_std::default_delete<char_*[]>_> __thiscall
CommandReader::args(CommandReader *this)

{
  undefined8 *puVar1;
  void *__s;
  CommandReader *pCVar2;
  long lVar3;
  long in_RSI;
  undefined8 *puVar4;
  long lVar5;
  ulong __n;
  
  pCVar2 = this;
  if (*(char *)(in_RSI + 2) == '\x01') {
    puVar4 = *(undefined8 **)(in_RSI + 0x28);
    puVar1 = *(undefined8 **)(in_RSI + 0x30);
    lVar5 = (long)puVar1 - (long)puVar4 >> 5;
    __n = -(ulong)(lVar5 + 1U >> 0x3d != 0) | lVar5 * 8 + 8U;
    __s = operator_new__(__n);
    memset(__s,0,__n);
    *(void **)this = __s;
    if (puVar1 != puVar4) {
      lVar3 = 0;
      do {
        *(undefined8 *)((long)__s + lVar3 * 8) = *puVar4;
        lVar3 = lVar3 + 1;
        puVar4 = puVar4 + 4;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar3);
    }
    pCVar2 = (CommandReader *)((long)__s + lVar5 * 8);
  }
  pCVar2->forced = false;
  pCVar2->escape = false;
  pCVar2->enclosed = false;
  pCVar2->field_0x3 = 0;
  pCVar2->state = STATE_NORMAL;
  return (__uniq_ptr_data<char_*,_std::default_delete<char_*[]>,_true,_true>)
         (__uniq_ptr_data<char_*,_std::default_delete<char_*[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<char *[]> args() const {
    // same
    if (!this->enclosed) {
      auto empty = std::unique_ptr<char *[]>();
      return empty;
    }

    auto args = std::make_unique<char *[]>(this->arguments.size() + 1);

    for (size_t i = 0; i < this->arguments.size(); i++) {
      args[i] = (char *)this->arguments[i].c_str();
    }

    args[this->arguments.size()] = nullptr;

    return args;
  }